

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryBooleanOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  bool bVar1;
  Op OVar2;
  uint uVar3;
  int iVar4;
  ConstantManager *this_00;
  Operand *pOVar5;
  uint *puVar6;
  Constant *pCVar7;
  undefined4 extraout_var;
  undefined8 local_90;
  uint local_78;
  uint local_74;
  uint32_t i_2;
  uint32_t i_1;
  Constant *constant;
  Operand *operand;
  uint32_t i;
  BoolConstant *constants [2];
  uint32_t ids [2];
  ConstantManager *const_manger;
  Op opcode;
  uint32_t *result_local;
  function<unsigned_int_(unsigned_int)> *id_map_local;
  Instruction *inst_local;
  InstructionFolder *this_local;
  
  OVar2 = opt::Instruction::opcode(inst);
  this_00 = IRContext::get_constant_mgr(this->context_);
  for (operand._4_4_ = 0; operand._4_4_ < 2; operand._4_4_ = operand._4_4_ + 1) {
    pOVar5 = opt::Instruction::GetInOperand(inst,operand._4_4_);
    if (pOVar5->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    puVar6 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pOVar5->words,0);
    uVar3 = std::function<unsigned_int_(unsigned_int)>::operator()(id_map,*puVar6);
    ids[(ulong)operand._4_4_ - 2] = uVar3;
    pCVar7 = analysis::ConstantManager::FindDeclaredConstant(this_00,ids[(ulong)operand._4_4_ - 2]);
    if (pCVar7 == (Constant *)0x0) {
      local_90 = 0;
    }
    else {
      iVar4 = (*pCVar7->_vptr_Constant[0x10])();
      local_90 = CONCAT44(extraout_var,iVar4);
    }
    *(undefined8 *)(&stack0xffffffffffffffa8 + (ulong)operand._4_4_ * 8) = local_90;
  }
  if (OVar2 == OpLogicalOr) {
    for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
      if ((*(long *)(&stack0xffffffffffffffa8 + (ulong)local_74 * 8) != 0) &&
         (bVar1 = analysis::BoolConstant::value
                            (*(BoolConstant **)(&stack0xffffffffffffffa8 + (ulong)local_74 * 8)),
         bVar1)) {
        *result = 1;
        return true;
      }
    }
  }
  else if (OVar2 == OpLogicalAnd) {
    for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
      if ((*(long *)(&stack0xffffffffffffffa8 + (ulong)local_78 * 8) != 0) &&
         (bVar1 = analysis::BoolConstant::value
                            (*(BoolConstant **)(&stack0xffffffffffffffa8 + (ulong)local_78 * 8)),
         !bVar1)) {
        *result = 0;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool InstructionFolder::FoldBinaryBooleanOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::BoolConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsBoolConstant() : nullptr);
  }

  switch (opcode) {
    // Logical
    case spv::Op::OpLogicalOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->value()) {
            *result = true;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpLogicalAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (!constants[i]->value()) {
            *result = false;
            return true;
          }
        }
      }
      break;

    default:
      break;
  }
  return false;
}